

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O3

matrix3d * tinyusdz::inverse(matrix3d *__return_storage_ptr__,matrix3d *_m)

{
  long lVar1;
  mat<double,_3,_3> *in_RDX;
  mat<double,_3,_3> *pmVar2;
  linalg *plVar3;
  matrix3d *pmVar4;
  byte bVar5;
  matrix33d inv_m;
  mat<double,_3,_3> local_a0;
  linalg local_58 [72];
  
  bVar5 = 0;
  plVar3 = local_58;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    *(double *)plVar3 = *(double *)_m;
    _m = (matrix3d *)((long)_m + 8);
    plVar3 = plVar3 + 8;
  }
  linalg::inverse<double,3>(&local_a0,local_58,in_RDX);
  pmVar2 = &local_a0;
  pmVar4 = __return_storage_ptr__;
  for (lVar1 = 9; lVar1 != 0; lVar1 = lVar1 + -1) {
    pmVar4->m[0][0] = (pmVar2->x).x;
    pmVar2 = (mat<double,_3,_3> *)((long)pmVar2 + (ulong)bVar5 * -0x10 + 8);
    pmVar4 = (matrix3d *)((long)pmVar4 + ((ulong)bVar5 * -2 + 1) * 8);
  }
  return __return_storage_ptr__;
}

Assistant:

value::matrix3d inverse(const value::matrix3d &_m) {
  matrix33d m;
  // memory layout is same
  memcpy(&m[0][0], _m.m, sizeof(double) * 3 * 3);

  matrix33d inv_m = linalg::inverse(m);

  value::matrix3d outm;

  memcpy(outm.m, &inv_m[0][0], sizeof(double) * 3 * 3);

  return outm;
}